

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
               (Nonzero<double> *keys,int end,ElementCompare *compare,int start,bool type)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  double *pdVar7;
  int in_ECX;
  undefined8 *puVar8;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  bool bVar9;
  int mid;
  int hi;
  int lo;
  Nonzero<double> tmp;
  Nonzero<double> pivotkey;
  ushort in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  double local_40;
  int local_38;
  int in_stack_ffffffffffffffcc;
  ElementCompare *in_stack_ffffffffffffffd0;
  int iVar10;
  undefined1 type_00;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar11;
  int iVar12;
  undefined4 in_stack_fffffffffffffff0;
  int iVar13;
  
  uVar1 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    iVar2 = in_ESI + -1;
    while (uVar11 = uVar1 & 0x1ffffff, 0x18 < iVar2 - in_ECX) {
      Nonzero<double>::Nonzero((Nonzero<double> *)&stack0xffffffffffffffd0);
      Nonzero<double>::Nonzero((Nonzero<double> *)&local_40);
      iVar3 = in_ECX + (iVar2 - in_ECX) / 2;
      puVar6 = (undefined8 *)(in_RDI + (long)iVar3 * 0x10);
      in_stack_ffffffffffffffd0 = (ElementCompare *)*puVar6;
      iVar10 = *(int *)(puVar6 + 1);
      iVar5 = in_ECX;
      iVar12 = in_ECX;
      iVar13 = iVar2;
      while( true ) {
        if ((uVar11 & 0x1000000) == 0) {
          while( true ) {
            bVar9 = false;
            if (iVar5 < iVar13) {
              iVar4 = SPxMainSM<double>::ElementCompare::operator()
                                ((ElementCompare *)CONCAT44(iVar5,iVar2),
                                 (Element *)CONCAT44(iVar3,in_ECX),
                                 (Element *)
                                 CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   (uint6)CONCAT14(in_stack_ffffffffffffffac,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           in_stack_ffffffffffffffa8))))));
              bVar9 = iVar4 < 1;
            }
            if (!bVar9) break;
            iVar5 = iVar5 + 1;
          }
          in_stack_ffffffffffffffad = 0;
          while( true ) {
            bVar9 = false;
            if (iVar12 < iVar2) {
              iVar4 = SPxMainSM<double>::ElementCompare::operator()
                                ((ElementCompare *)CONCAT44(iVar5,iVar2),
                                 (Element *)CONCAT44(iVar3,in_ECX),
                                 (Element *)
                                 CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT15(in_stack_ffffffffffffffad,
                                                            (uint5)CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           in_stack_ffffffffffffffa8))))));
              bVar9 = 0 < iVar4;
            }
            if (!bVar9) break;
            iVar2 = iVar2 + -1;
          }
          in_stack_ffffffffffffffac = 0;
        }
        else {
          while( true ) {
            bVar9 = false;
            if (iVar5 < iVar13) {
              iVar4 = SPxMainSM<double>::ElementCompare::operator()
                                ((ElementCompare *)CONCAT44(iVar5,iVar2),
                                 (Element *)CONCAT44(iVar3,in_ECX),
                                 (Element *)
                                 (ulong)CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           in_stack_ffffffffffffffa8))))));
              bVar9 = iVar4 < 0;
            }
            if (!bVar9) break;
            iVar5 = iVar5 + 1;
          }
          in_stack_ffffffffffffffaf = 0;
          while( true ) {
            bVar9 = false;
            if (iVar12 < iVar2) {
              iVar4 = SPxMainSM<double>::ElementCompare::operator()
                                ((ElementCompare *)CONCAT44(iVar5,iVar2),
                                 (Element *)CONCAT44(iVar3,in_ECX),
                                 (Element *)
                                 CONCAT17(in_stack_ffffffffffffffaf,
                                          (uint7)CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           in_stack_ffffffffffffffa8))))));
              bVar9 = -1 < iVar4;
            }
            if (!bVar9) break;
            iVar2 = iVar2 + -1;
          }
          in_stack_ffffffffffffffae = 0;
        }
        if (iVar2 <= iVar5) break;
        pdVar7 = (double *)(in_RDI + (long)iVar5 * 0x10);
        local_40 = *pdVar7;
        local_38 = *(int *)(pdVar7 + 1);
        puVar8 = (undefined8 *)(in_RDI + (long)iVar2 * 0x10);
        puVar6 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
        *puVar6 = *puVar8;
        *(undefined4 *)(puVar6 + 1) = *(undefined4 *)(puVar8 + 1);
        pdVar7 = (double *)(in_RDI + (long)iVar2 * 0x10);
        *pdVar7 = local_40;
        *(int *)(pdVar7 + 1) = local_38;
        iVar5 = iVar5 + 1;
        iVar2 = iVar2 + -1;
      }
      if ((uVar11 & 0x1000000) == 0) {
        while( true ) {
          bVar9 = false;
          if (iVar12 < iVar2) {
            iVar4 = SPxMainSM<double>::ElementCompare::operator()
                              ((ElementCompare *)CONCAT44(iVar5,iVar2),
                               (Element *)CONCAT44(iVar3,in_ECX),
                               (Element *)
                               CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  (uint3)in_stack_ffffffffffffffa8))))));
            bVar9 = iVar4 < 1;
          }
          type_00 = (undefined1)((uint)iVar10 >> 0x18);
          if (!bVar9) break;
          iVar2 = iVar2 + -1;
        }
        if (iVar2 == iVar13) {
          pdVar7 = (double *)(in_RDI + (long)iVar2 * 0x10);
          local_40 = *pdVar7;
          local_38 = *(int *)(pdVar7 + 1);
          puVar8 = (undefined8 *)(in_RDI + (long)iVar3 * 0x10);
          puVar6 = (undefined8 *)(in_RDI + (long)iVar2 * 0x10);
          *puVar6 = *puVar8;
          *(undefined4 *)(puVar6 + 1) = *(undefined4 *)(puVar8 + 1);
          pdVar7 = (double *)(in_RDI + (long)iVar3 * 0x10);
          *pdVar7 = local_40;
          *(int *)(pdVar7 + 1) = local_38;
          iVar2 = iVar2 + -1;
        }
        in_stack_ffffffffffffffaa = 0;
      }
      else {
        while( true ) {
          bVar9 = false;
          if (iVar5 < iVar13) {
            iVar4 = SPxMainSM<double>::ElementCompare::operator()
                              ((ElementCompare *)CONCAT44(iVar5,iVar2),
                               (Element *)CONCAT44(iVar3,in_ECX),
                               (Element *)
                               CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT15(in_stack_ffffffffffffffad,
                                                          CONCAT14(in_stack_ffffffffffffffac,
                                                                   (uint)CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  in_stack_ffffffffffffffa8))))));
            bVar9 = -1 < iVar4;
          }
          type_00 = (undefined1)((uint)iVar10 >> 0x18);
          if (!bVar9) break;
          iVar5 = iVar5 + 1;
        }
        if (iVar5 == iVar12) {
          pdVar7 = (double *)(in_RDI + (long)iVar5 * 0x10);
          local_40 = *pdVar7;
          local_38 = *(int *)(pdVar7 + 1);
          puVar8 = (undefined8 *)(in_RDI + (long)iVar3 * 0x10);
          puVar6 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          *puVar6 = *puVar8;
          *(undefined4 *)(puVar6 + 1) = *(undefined4 *)(puVar8 + 1);
          pdVar7 = (double *)(in_RDI + (long)iVar3 * 0x10);
          *pdVar7 = local_40;
          *(int *)(pdVar7 + 1) = local_38;
          iVar5 = iVar5 + 1;
        }
        in_stack_ffffffffffffffab = 0;
      }
      iVar10 = (int)((ulong)in_RDX >> 0x20);
      if (iVar13 - iVar5 < iVar2 - iVar12) {
        bVar9 = iVar5 < iVar13;
        iVar5 = iVar12;
        if (bVar9) {
          SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                    ((Nonzero<double> *)CONCAT44(iVar13,in_stack_fffffffffffffff0),iVar10,
                     (ElementCompare *)CONCAT44(iVar12,uVar11),in_stack_ffffffffffffffdc,
                     (bool)type_00);
          iVar5 = iVar12;
        }
      }
      else {
        bVar9 = iVar12 < iVar2;
        iVar2 = iVar13;
        if (bVar9) {
          SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                    ((Nonzero<double> *)CONCAT44(iVar13,in_stack_fffffffffffffff0),iVar10,
                     (ElementCompare *)CONCAT44(iVar12,uVar11),in_stack_ffffffffffffffdc,
                     (bool)type_00);
          iVar2 = iVar13;
        }
      }
      uVar1 = uVar11 ^ 0xff000000;
      in_ECX = iVar5;
    }
    if (0 < iVar2 - in_ECX) {
      SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                ((Nonzero<double> *)(CONCAT44(in_ECX,uVar1) & 0xffffffff01ffffff),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}